

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int exprMightBeIndexed(SrcList *pFrom,int op,Bitmask mPrereq,Expr *pExpr,int *piCur,int *piColumn)

{
  ushort uVar1;
  Index *pIVar2;
  ExprList *pEVar3;
  u8 uVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  Index **ppIVar9;
  ulong uVar10;
  
  uVar4 = pExpr->op;
  if (op - 0x26U < 4 && uVar4 == 0x9e) {
    pExpr = ((pExpr->x).pList)->a->pExpr;
    uVar4 = pExpr->op;
  }
  if (uVar4 == 0x98) {
    *piCur = pExpr->iTable;
    iVar5 = (int)pExpr->iColumn;
LAB_0015d8da:
    *piColumn = iVar5;
    iVar5 = 1;
  }
  else {
    iVar5 = 0;
    if (mPrereq - 1 < (mPrereq ^ mPrereq - 1)) {
      piVar7 = &pFrom->a[0].iCursor;
      for (; 1 < mPrereq; mPrereq = mPrereq >> 1) {
        piVar7 = piVar7 + 0x1c;
      }
      iVar5 = *piVar7;
      ppIVar9 = &(*(Table **)(piVar7 + -9))->pIndex;
      while (pIVar2 = *ppIVar9, pIVar2 != (Index *)0x0) {
        pEVar3 = pIVar2->aColExpr;
        if (pEVar3 != (ExprList *)0x0) {
          uVar1 = pIVar2->nKeyCol;
          lVar8 = 0;
          for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
            if (pIVar2->aiColumn[uVar10] == -2) {
              iVar6 = sqlite3ExprCompare(pExpr,*(Expr **)((long)&pEVar3->a->pExpr + lVar8),iVar5);
              if (iVar6 == 0) {
                *piCur = iVar5;
                iVar5 = -2;
                goto LAB_0015d8da;
              }
            }
            lVar8 = lVar8 + 0x20;
          }
        }
        ppIVar9 = &pIVar2->pNext;
      }
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static int exprMightBeIndexed(
  SrcList *pFrom,        /* The FROM clause */
  int op,                /* The specific comparison operator */
  Bitmask mPrereq,       /* Bitmask of FROM clause terms referenced by pExpr */
  Expr *pExpr,           /* An operand of a comparison operator */
  int *piCur,            /* Write the referenced table cursor number here */
  int *piColumn          /* Write the referenced table column number here */
){
  Index *pIdx;
  int i;
  int iCur;

  /* If this expression is a vector to the left or right of a 
  ** inequality constraint (>, <, >= or <=), perform the processing 
  ** on the first element of the vector.  */
  assert( TK_GT+1==TK_LE && TK_GT+2==TK_LT && TK_GT+3==TK_GE );
  assert( TK_IS<TK_GE && TK_ISNULL<TK_GE && TK_IN<TK_GE );
  assert( op<=TK_GE );
  if( pExpr->op==TK_VECTOR && (op>=TK_GT && ALWAYS(op<=TK_GE)) ){
    pExpr = pExpr->x.pList->a[0].pExpr;
  }

  if( pExpr->op==TK_COLUMN ){
    *piCur = pExpr->iTable;
    *piColumn = pExpr->iColumn;
    return 1;
  }
  if( mPrereq==0 ) return 0;                 /* No table references */
  if( (mPrereq&(mPrereq-1))!=0 ) return 0;   /* Refs more than one table */
  for(i=0; mPrereq>1; i++, mPrereq>>=1){}
  iCur = pFrom->a[i].iCursor;
  for(pIdx=pFrom->a[i].pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    if( pIdx->aColExpr==0 ) continue;
    for(i=0; i<pIdx->nKeyCol; i++){
      if( pIdx->aiColumn[i]!=XN_EXPR ) continue;
      if( sqlite3ExprCompare(pExpr, pIdx->aColExpr->a[i].pExpr, iCur)==0 ){
        *piCur = iCur;
        *piColumn = XN_EXPR;
        return 1;
      }
    }
  }
  return 0;
}